

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_syms.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  void *__ptr;
  char **in_RSI;
  int in_EDI;
  _Bool success;
  int c;
  uint32_t *ESIs;
  int n_max_ESIs;
  int n_ESIs;
  opmode mode;
  int T;
  int K;
  int in_stack_00000044;
  int in_stack_0000004c;
  int in_stack_00000050;
  int in_stack_00000054;
  _Bool local_35;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint local_4;
  
  iVar6 = 0x3c;
  iVar5 = 0x10;
  iVar4 = 0;
  uVar3 = 0;
  uVar2 = 0x20;
  __ptr = malloc(0x80);
  do {
    iVar1 = getopt(in_EDI,in_RSI,"hm:K:T:i:");
    if (iVar1 == -1) {
      iVar6 = fileno(_stdout);
      iVar6 = isatty(iVar6);
      if (iVar6 == 0) {
        local_35 = true;
        if (iVar4 == 0) {
          local_35 = gen_iblock(in_stack_00000054,in_stack_00000050,in_stack_0000004c,
                                (uint32_t *)CONCAT44(in_stack_00000044,argc));
        }
        else if (iVar4 == 1) {
          local_35 = gen_iosym(in_stack_00000044,argc,argv._4_4_,_T);
        }
        free(__ptr);
        local_4 = (uint)(local_35 == false);
      }
      else {
        fprintf(_stderr,
                "Error:  Output is a TTY, refusing output since it will garble the screen.\n");
        local_4 = 1;
      }
      return local_4;
    }
    switch(iVar1) {
    case 0x3f:
      exit(1);
    case 0x4b:
      iVar6 = atoi(_optarg);
      break;
    case 0x54:
      iVar5 = atoi(_optarg);
      break;
    case 0x68:
      usage();
      return 0;
    case 0x69:
      parse_esis((int *)in_RSI,(int *)CONCAT44(iVar6,iVar5),(uint32_t **)CONCAT44(iVar4,uVar3),
                 (char *)CONCAT44(uVar2,in_stack_ffffffffffffffd8));
      break;
    case 0x6d:
      iVar4 = strcasecmp(_optarg,"iblock");
      if (iVar4 == 0) {
        iVar4 = 0;
      }
      else {
        iVar4 = strcasecmp(_optarg,"iosym");
        if (iVar4 != 0) {
          fprintf(_stderr,"Error: Mode `%s\' unknown (-m).\n",_optarg);
          return 1;
        }
        iVar4 = 1;
      }
    }
  } while( true );
}

Assistant:

int main(int argc, char** argv)
{
	int K = 60;
	int T = 16;
	opmode mode = OPMODE_IBLOCK;

	/* ESI array */
	int n_ESIs = 0;
	int n_max_ESIs = 32;
	uint32_t* ESIs = malloc(n_max_ESIs * sizeof(uint32_t));

	/* Read command line arguments */
	int c;
	while ((c = getopt(argc, argv, "hm:K:T:i:")) != -1) {
		switch (c) {
		case 'h':
			usage();
			return EXIT_SUCCESS;
		case 'm':
			if (strcasecmp(optarg, "iblock") == 0) {
				mode = OPMODE_IBLOCK;
			} else if (strcasecmp(optarg, "iosym") == 0) {
				mode = OPMODE_IOSYM;
			} else {
				fprintf(stderr, "Error: Mode `%s' unknown "
						"(-m).\n", optarg);
				return EXIT_FAILURE;
			}
			break;
		case 'K':
			K = atoi(optarg);
			break;
		case 'T':
			T = atoi(optarg);
			break;
		case 'i': {
			parse_esis(&n_ESIs, &n_max_ESIs, &ESIs, optarg);
			break;
		}
		case '?':
			exit(EXIT_FAILURE);
		};
	}


	/* Check TTY status */
	if (isatty(fileno(stdout))) {
		fprintf(stderr, "Error:  Output is a TTY, refusing output "
		  "since it will garble the screen.\n");
		return EXIT_FAILURE;
	}

	/* Create Inter Program */
	bool success = true;
	switch (mode) {
		case OPMODE_IBLOCK:
			success = gen_iblock(K, T, n_ESIs, ESIs);
			break;
		case OPMODE_IOSYM:
			success = gen_iosym(K, T, n_ESIs, ESIs);
			break;
	};

	/* Finish */
	free(ESIs);
	return success ? EXIT_SUCCESS : EXIT_FAILURE;
}